

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

char * mg_get_option(mg_context *ctx,char *name)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  mg_option *pmVar4;
  int i;
  long lVar5;
  
  pcVar3 = "listening_ports";
  pmVar4 = config_options;
  lVar5 = 0;
  do {
    pmVar4 = pmVar4 + 1;
    iVar2 = strcmp(pcVar3,name);
    if (iVar2 == 0) goto LAB_0010b970;
    lVar5 = lVar5 + 1;
    pcVar3 = pmVar4->name;
  } while (lVar5 != 0x3a);
  lVar5 = 0xffffffff;
LAB_0010b970:
  if ((int)lVar5 == -1) {
    pcVar3 = (char *)0x0;
  }
  else if (ctx == (mg_context *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar1 = (ctx->dd).config[(int)lVar5];
    pcVar3 = "";
    if (pcVar1 != (char *)0x0) {
      pcVar3 = pcVar1;
    }
  }
  return pcVar3;
}

Assistant:

CIVETWEB_API const char *
mg_get_option(const struct mg_context *ctx, const char *name)
{
	int i;
	if ((i = get_option_index(name)) == -1) {
		return NULL;
	} else if (!ctx || ctx->dd.config[i] == NULL) {
		return "";
	} else {
		return ctx->dd.config[i];
	}
}